

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void palette_reset(Terminal *term,_Bool keep_overrides)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  char cVar4;
  ulong uVar5;
  char cVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint uVar9;
  char cVar10;
  uint uVar11;
  int *piVar12;
  int secondary;
  long lVar13;
  
  memset(term->subpalettes[0].present,1,0x106);
  piVar12 = colour_indices_conf_to_osc4;
  lVar13 = 0;
  do {
    iVar1 = *piVar12;
    secondary = (int)lVar13;
    iVar2 = conf_get_int_int(term->conf,0x95,secondary);
    term->subpalettes[0].values[iVar1].r = (uint8_t)iVar2;
    iVar2 = conf_get_int_int(term->conf,0x95,secondary + 1);
    term->subpalettes[0].values[iVar1].g = (uint8_t)iVar2;
    iVar2 = conf_get_int_int(term->conf,0x95,secondary + 2);
    term->subpalettes[0].values[iVar1].b = (uint8_t)iVar2;
    lVar13 = lVar13 + 3;
    piVar12 = piVar12 + 1;
  } while (lVar13 != 0x42);
  puVar3 = &term->subpalettes[0].values[0x10].b;
  cVar4 = '7';
  uVar5 = 0;
  do {
    uVar9 = (uint)uVar5 & 0xff;
    uVar11 = uVar9 / 6;
    cVar6 = (char)uVar11;
    uVar7 = cVar6 * '\x10' + cVar4;
    cVar10 = cVar6 + ((byte)(uVar11 / 3) & 0xfe) * -3;
    uVar8 = ((byte)(uVar9 * 0x39 >> 8) & 0xf8) * '\x05' + '7';
    if (uVar5 < 0x24) {
      uVar8 = '\0';
    }
    ((rgb *)(puVar3 + -2))->r = uVar8;
    uVar8 = cVar10 * '(' + '7';
    if (cVar10 == '\0') {
      uVar8 = '\0';
    }
    puVar3[-1] = uVar8;
    if ((char)uVar5 == (char)(cVar6 * '\x06')) {
      uVar7 = '\0';
    }
    *puVar3 = uVar7;
    uVar5 = uVar5 + 1;
    cVar4 = cVar4 + '(';
    puVar3 = puVar3 + 3;
  } while (uVar5 != 0xd8);
  cVar4 = '\b';
  lVar13 = 0x151a;
  do {
    *(char *)((long)&term->compatibility_level + lVar13) = cVar4;
    *(char *)((long)term + lVar13 + -1) = cVar4;
    *(char *)((long)term + lVar13 + -2) = cVar4;
    cVar4 = cVar4 + '\n';
    lVar13 = lVar13 + 3;
  } while (lVar13 != 0x1562);
  memset(term->subpalettes[1].present,0,0x106);
  (*term->win->vt->palette_get_overrides)(term->win,term);
  if (!keep_overrides) {
    memset(term->subpalettes[2].present,0,0x106);
  }
  palette_rebuild(term);
  return;
}

Assistant:

static void palette_reset(Terminal *term, bool keep_overrides)
{
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_CONF].present[i] = true;

    /*
     * Copy all the palette information out of the Conf.
     */
    for (unsigned i = 0; i < CONF_NCOLOURS; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[
            colour_indices_conf_to_osc4[i]];
        col->r = conf_get_int_int(term->conf, CONF_colours, i*3+0);
        col->g = conf_get_int_int(term->conf, CONF_colours, i*3+1);
        col->b = conf_get_int_int(term->conf, CONF_colours, i*3+2);
    }

    /*
     * Directly invent the rest of the xterm-256 colours.
     */
    for (unsigned i = 0; i < 216; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 16];
        int r = i / 36, g = (i / 6) % 6, b = i % 6;
        col->r = r ? r * 40 + 55 : 0;
        col->g = g ? g * 40 + 55 : 0;
        col->b = b ? b * 40 + 55 : 0;
    }
    for (unsigned i = 0; i < 24; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 232];
        int shade = i * 10 + 8;
        col->r = col->g = col->b = shade;
    }

    /*
     * Re-fetch any OS-local overrides.
     */
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_PLATFORM].present[i] = false;
    win_palette_get_overrides(term->win, term);

    if (!keep_overrides) {
        /*
         * Get rid of all escape-sequence configuration.
         */
        for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
            term->subpalettes[SUBPAL_SESSION].present[i] = false;
    }

    /*
     * Rebuild the composite palette.
     */
    palette_rebuild(term);
}